

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::BP4Reader::OpenFiles
          (BP4Reader *this,TimePoint *timeoutInstant,Seconds *pollSeconds,Seconds *timeoutSeconds)

{
  string *name;
  Comm *this_00;
  BP4Deserializer *pBVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _func_int **pp_Var3;
  undefined1 *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  undefined8 *puVar6;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong *puVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  pointer pbVar11;
  undefined8 uVar12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  string metadataFile;
  size_t flag;
  string metadataIndexFile;
  string lasterrmsg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  undefined1 local_158 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  undefined1 local_128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  unsigned_long local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_f8 = 1;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  pBVar1 = &this->m_BP4Deserializer;
  pp_Var3 = (this->m_BP4Deserializer)._vptr_BP4Deserializer;
  if (*(int *)(pp_Var3[-4] + 0x10 + (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer) == 0) {
    name = &(this->super_Engine).m_Name;
    adios2::format::BP4Base::GetBPMetadataIndexFileName
              (&local_d0,(BP4Base *)((long)&pBVar1->_vptr_BP4Deserializer + (long)pp_Var3[-3]),name)
    ;
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_178,local_d0._M_dataplus._M_p,
               local_d0._M_dataplus._M_p + local_d0._M_string_length);
    __l._M_len = 1;
    __l._M_array = &local_178;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_138,__l,(allocator_type *)local_158);
    local_f8 = OpenWithTimeout(this,&this->m_MDIndexFileManager,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_138,timeoutInstant,pollSeconds,&local_b0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if (local_f8 == 0) {
      adios2::format::BP4Base::GetBPMetadataFileName
                (&local_178,
                 (BP4Base *)
                 ((long)&pBVar1->_vptr_BP4Deserializer + (long)pBVar1->_vptr_BP4Deserializer[-3]),
                 name);
      if ((timeoutSeconds->__r == 0.0) && (!NAN(timeoutSeconds->__r))) {
        (timeoutInstant->__d).__r = (timeoutInstant->__d).__r + 5000000000.0;
      }
      local_138._M_allocated_capacity = (size_type)local_128;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_138,local_178._M_dataplus._M_p,
                 local_178._M_dataplus._M_p + local_178._M_string_length);
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_138;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_158,__l_00,(allocator_type *)local_118._M_local_buf);
      local_f8 = OpenWithTimeout(this,&this->m_MDFileManager,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_158,timeoutInstant,pollSeconds,&local_b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_158);
      if ((undefined1 *)local_138._M_allocated_capacity != local_128) {
        operator_delete((void *)local_138._M_allocated_capacity);
      }
      if (local_f8 != 0) {
        transportman::TransportMan::CloseFiles(&this->m_MDIndexFileManager,-1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  paVar2 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"wait for rank 0 to open...","");
  this_00 = &(this->super_Engine).m_Comm;
  helper::Comm::Barrier(this_00,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_f8 = helper::Comm::BroadcastValue<unsigned_long>(this_00,&local_f8,0);
  if (local_f8 == 1) {
    if (*(int *)(pBVar1->_vptr_BP4Deserializer[-4] + 0x10 +
                (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer) == 0) {
      local_d0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Engine","");
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"BP4Reader","");
      local_138._M_allocated_capacity = (size_type)local_128;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"OpenFiles","");
      std::operator+(&local_70,"File ",&(this->super_Engine).m_Name);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
      paVar8 = &local_90.field_2;
      puVar9 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_90.field_2._M_allocated_capacity = *puVar9;
        local_90.field_2._8_8_ = plVar7[3];
        local_90._M_dataplus._M_p = (pointer)paVar8;
      }
      else {
        local_90.field_2._M_allocated_capacity = *puVar9;
        local_90._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_90._M_string_length = plVar7[1];
      *plVar7 = (long)puVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_50,vsnprintf,0x148,"%f",timeoutSeconds->__r);
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar8) {
        uVar12 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_50._M_string_length + local_90._M_string_length) {
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          uVar12 = local_50.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_50._M_string_length + local_90._M_string_length)
        goto LAB_0044136d;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_50,0,(char *)0x0,(ulong)local_90._M_dataplus._M_p);
      }
      else {
LAB_0044136d:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_50._M_dataplus._M_p)
        ;
      }
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      puVar9 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_f0.field_2._M_allocated_capacity = *puVar9;
        local_f0.field_2._8_8_ = puVar6[3];
      }
      else {
        local_f0.field_2._M_allocated_capacity = *puVar9;
        local_f0._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_f0._M_string_length = puVar6[1];
      *puVar6 = puVar9;
      puVar6[1] = 0;
      *(undefined1 *)puVar9 = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 == paVar10) {
        local_108._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_108._8_8_ = puVar6[3];
        local_118._M_allocated_capacity = (size_type)&local_108;
      }
      else {
        local_108._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_118._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar6;
      }
      local_118._8_8_ = puVar6[1];
      *puVar6 = paVar10;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 (local_118._M_local_buf,(ulong)local_b0._M_dataplus._M_p);
      pbVar11 = (pointer)(plVar7 + 2);
      if ((pointer)*plVar7 == pbVar11) {
        local_158._16_8_ = (pbVar11->_M_dataplus)._M_p;
        local_158._24_8_ = plVar7[3];
        local_158._0_8_ = (pointer)(local_158 + 0x10);
      }
      else {
        local_158._16_8_ = (pbVar11->_M_dataplus)._M_p;
        local_158._0_8_ = (pointer)*plVar7;
      }
      local_158._8_8_ = plVar7[1];
      *plVar7 = (long)pbVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (&local_d0,&local_178,(string *)&local_138,(string *)local_158,-1);
      if ((pointer)local_158._0_8_ != (pointer)(local_158 + 0x10)) {
        operator_delete((void *)local_158._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_allocated_capacity != &local_108) {
        operator_delete((void *)local_118._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar8) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      pbVar5 = &local_70;
    }
    else {
      local_d0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Engine","");
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"BP4Reader","");
      local_138._M_allocated_capacity = (size_type)local_128;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"OpenFiles","");
      std::operator+(&local_90,"File ",&(this->super_Engine).m_Name);
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
      paVar8 = &local_f0.field_2;
      puVar9 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar9) {
        local_f0.field_2._M_allocated_capacity = *puVar9;
        local_f0.field_2._8_8_ = puVar6[3];
        local_f0._M_dataplus._M_p = (pointer)paVar8;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *puVar9;
        local_f0._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_f0._M_string_length = puVar6[1];
      *puVar6 = puVar9;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_70,vsnprintf,0x148,"%f",timeoutSeconds->__r);
      uVar12 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar8) {
        uVar12 = local_f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar12 < local_70._M_string_length + local_f0._M_string_length) {
        uVar12 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          uVar12 = local_70.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar12 < local_70._M_string_length + local_f0._M_string_length)
        goto LAB_00440fec;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_70,0,(char *)0x0,(ulong)local_f0._M_dataplus._M_p);
      }
      else {
LAB_00440fec:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_70._M_dataplus._M_p)
        ;
      }
      local_118._M_allocated_capacity = (size_type)&local_108;
      paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 == paVar10) {
        local_108._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_108._8_8_ = puVar6[3];
      }
      else {
        local_108._M_allocated_capacity = paVar10->_M_allocated_capacity;
        local_118._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar6;
      }
      local_118._8_8_ = puVar6[1];
      *puVar6 = paVar10;
      puVar6[1] = 0;
      paVar10->_M_local_buf[0] = '\0';
      plVar7 = (long *)std::__cxx11::string::append(local_118._M_local_buf);
      pbVar11 = (pointer)(plVar7 + 2);
      if ((pointer)*plVar7 == pbVar11) {
        local_158._16_8_ = (pbVar11->_M_dataplus)._M_p;
        local_158._24_8_ = plVar7[3];
        local_158._0_8_ = (pointer)(local_158 + 0x10);
      }
      else {
        local_158._16_8_ = (pbVar11->_M_dataplus)._M_p;
        local_158._0_8_ = (pointer)*plVar7;
      }
      local_158._8_8_ = plVar7[1];
      *plVar7 = (long)pbVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (&local_d0,&local_178,(string *)&local_138,(string *)local_158,-1);
      if ((pointer)local_158._0_8_ != (pointer)(local_158 + 0x10)) {
        operator_delete((void *)local_158._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_allocated_capacity != &local_108) {
        operator_delete((void *)local_118._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar8) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      pbVar5 = &local_90;
    }
    puVar4 = (undefined1 *)(&(pbVar5->field_2)._M_allocated_capacity)[-2];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar4 != &pbVar5->field_2) {
      operator_delete(puVar4);
    }
    if ((undefined1 *)local_138._M_allocated_capacity != local_128) {
      operator_delete((void *)local_138._M_allocated_capacity);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
LAB_00441156:
      operator_delete(local_178._M_dataplus._M_p);
    }
  }
  else {
    if (local_f8 != 2) goto LAB_0044116d;
    if ((*(int *)(pBVar1->_vptr_BP4Deserializer[-4] + 0x10 +
                 (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer) == 0) &&
       (local_b0._M_string_length != 0)) {
      local_d0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Engine","");
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"BP4Reader","");
      local_138._M_allocated_capacity = (size_type)local_128;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"OpenFiles","");
      std::operator+(&local_f0,"File ",&(this->super_Engine).m_Name);
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 == paVar8) {
        local_108._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_108._8_8_ = puVar6[3];
        local_118._M_allocated_capacity = (size_type)&local_108;
      }
      else {
        local_108._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_118._M_allocated_capacity =
             (size_type)
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar6;
      }
      local_118._8_8_ = puVar6[1];
      *puVar6 = paVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 (local_118._M_local_buf,(ulong)local_b0._M_dataplus._M_p);
      pbVar11 = (pointer)(plVar7 + 2);
      if ((pointer)*plVar7 == pbVar11) {
        local_158._16_8_ = (pbVar11->_M_dataplus)._M_p;
        local_158._24_8_ = plVar7[3];
        local_158._0_8_ = (pointer)(local_158 + 0x10);
      }
      else {
        local_158._16_8_ = (pbVar11->_M_dataplus)._M_p;
        local_158._0_8_ = (pointer)*plVar7;
      }
      local_158._8_8_ = plVar7[1];
      *plVar7 = (long)pbVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (&local_d0,&local_178,(string *)&local_138,(string *)local_158,-1);
      if ((pointer)local_158._0_8_ != (pointer)(local_158 + 0x10)) {
        operator_delete((void *)local_158._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_allocated_capacity != &local_108) {
        operator_delete((void *)local_118._M_allocated_capacity);
      }
      paVar8 = &local_f0.field_2;
    }
    else {
      local_d0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Engine","");
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"BP4Reader","");
      local_138._M_allocated_capacity = (size_type)local_128;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"OpenFiles","");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118
                     ,"File ",&(this->super_Engine).m_Name);
      plVar7 = (long *)std::__cxx11::string::append(local_118._M_local_buf);
      pbVar11 = (pointer)(plVar7 + 2);
      if ((pointer)*plVar7 == pbVar11) {
        local_158._16_8_ = (pbVar11->_M_dataplus)._M_p;
        local_158._24_8_ = plVar7[3];
        local_158._0_8_ = (pointer)(local_158 + 0x10);
      }
      else {
        local_158._16_8_ = (pbVar11->_M_dataplus)._M_p;
        local_158._0_8_ = (pointer)*plVar7;
      }
      local_158._8_8_ = plVar7[1];
      *plVar7 = (long)pbVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (&local_d0,&local_178,(string *)&local_138,(string *)local_158,-1);
      if ((pointer)local_158._0_8_ != (pointer)(local_158 + 0x10)) {
        operator_delete((void *)local_158._0_8_);
      }
      paVar8 = &local_108;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(&paVar8->_M_allocated_capacity)[-2] != paVar8) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar8->_M_allocated_capacity)[-2]);
    }
    if ((undefined1 *)local_138._M_allocated_capacity != local_128) {
      operator_delete((void *)local_138._M_allocated_capacity);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) goto LAB_00441156;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
LAB_0044116d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void BP4Reader::OpenFiles(TimePoint &timeoutInstant, const Seconds &pollSeconds,
                          const Seconds &timeoutSeconds)
{
    /* Poll */
    size_t flag = 1; // 0 = OK, opened file, 1 = timeout, 2 = error
    std::string lasterrmsg;
    if (m_BP4Deserializer.m_RankMPI == 0)
    {
        /* Open the metadata index table */
        const std::string metadataIndexFile(m_BP4Deserializer.GetBPMetadataIndexFileName(m_Name));
        flag = OpenWithTimeout(m_MDIndexFileManager, {metadataIndexFile}, timeoutInstant,
                               pollSeconds, lasterrmsg);
        if (flag == 0)
        {
            /* Open the metadata file */
            const std::string metadataFile(m_BP4Deserializer.GetBPMetadataFileName(m_Name));

            /* We found md.idx. If we don't find md.0 immediately  we should
             * wait a little bit hoping for the file system to catch up.
             * This slows down finding the error in file reading mode but
             * it will be more robust in streaming mode
             */
            if (timeoutSeconds == Seconds(0.0))
            {
                timeoutInstant += Seconds(5.0);
            }

            flag = OpenWithTimeout(m_MDFileManager, {metadataFile}, timeoutInstant, pollSeconds,
                                   lasterrmsg);
            if (flag != 0)
            {
                /* Close the metadata index table */
                m_MDIndexFileManager.CloseFiles();
            }
        }
    }
    m_Comm.Barrier("wait for rank 0 to open...");
    flag = m_Comm.BroadcastValue(flag, 0);
    if (flag == 2)
    {
        if (m_BP4Deserializer.m_RankMPI == 0 && !lasterrmsg.empty())
        {
            helper::Throw<std::ios_base::failure>("Engine", "BP4Reader", "OpenFiles",
                                                  "File " + m_Name +
                                                      " cannot be opened: " + lasterrmsg);
        }
        else
        {
            helper::Throw<std::ios_base::failure>("Engine", "BP4Reader", "OpenFiles",
                                                  "File " + m_Name + " cannot be opened");
        }
    }
    else if (flag == 1)
    {
        if (m_BP4Deserializer.m_RankMPI == 0)
        {
            helper::Throw<std::ios_base::failure>(
                "Engine", "BP4Reader", "OpenFiles",
                "File " + m_Name + " could not be found within the " +
                    std::to_string(timeoutSeconds.count()) + "s timeout: " + lasterrmsg);
        }
        else
        {
            helper::Throw<std::ios_base::failure>(
                "Engine", "BP4Reader", "OpenFiles",
                "File " + m_Name + " could not be found within the " +
                    std::to_string(timeoutSeconds.count()) + "s timeout");
        }
    }

    /* At this point we may have an empty index table.
     * The writer has created the file but no content may have been stored yet.
     */
}